

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::
TPZGeoElRefPattern(TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                   *this)

{
  TPZRegisterClassId *in_RDI;
  void **in_stack_00000038;
  int64_t in_stack_ffffffffffffffb8;
  TPZRefPattern *in_stack_ffffffffffffffd8;
  TPZAutoPointer<TPZRefPattern> *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::
  TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>>>>
            (in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0246a948);
  TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::TPZGeoElRefLess
            (&this->
              super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
             ,in_stack_00000038);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_0246a620;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_0246a620;
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0xbc0),in_stack_ffffffffffffffb8);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8)
  ;
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern():TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),
TPZGeoElRefLess<TGeo>(), fSubEl(0), fRefPattern(0)
{
}